

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

wchar_t prt_sp_short(wchar_t row,wchar_t col)

{
  uint8_t attr;
  wchar_t col_00;
  size_t sVar1;
  size_t sVar2;
  char local_58 [7];
  uint8_t color;
  char max_sp [32];
  char cur_sp [32];
  wchar_t col_local;
  wchar_t row_local;
  
  attr = player_sp_attr(player);
  if (((player->class->magic).total_spells == 0) ||
     ((int)player->lev < (player->class->magic).spell_first)) {
    col_local = L'\0';
  }
  else {
    put_str("SP:",row,col);
    strnfmt(local_58,0x20,"%d",(ulong)(uint)(int)player->msp);
    strnfmt(max_sp + 0x18,0x20,"%d",(ulong)(uint)(int)player->csp);
    c_put_str(attr,max_sp + 0x18,row,col + L'\x03');
    sVar1 = strlen(max_sp + 0x18);
    col_00 = col + L'\x03' + (int)sVar1;
    c_put_str('\x01',"/",row,col_00);
    c_put_str('\r',local_58,row,col_00 + L'\x01');
    sVar1 = strlen(max_sp + 0x18);
    sVar2 = strlen(local_58);
    col_local = (int)sVar1 + 5 + (int)sVar2;
  }
  return col_local;
}

Assistant:

static int prt_sp_short(int row, int col)
{
	char cur_sp[32], max_sp[32];
	uint8_t color = player_sp_attr(player);

	/* Do not show mana unless we should have some */
	if (!player->class->magic.total_spells
			|| (player->lev < player->class->magic.spell_first))
		return 0;

	put_str("SP:", row, col);
	col += 3;

	strnfmt(max_sp, sizeof(max_sp), "%d", player->msp);
	strnfmt(cur_sp, sizeof(cur_sp), "%d", player->csp);

	/* Show mana */
	c_put_str(color, cur_sp, row, col);
	col += strlen(cur_sp);
	c_put_str(COLOUR_WHITE, "/", row, col);
	col += 1;
	c_put_str(COLOUR_L_GREEN, max_sp, row, col);
	return 5+strlen(cur_sp)+strlen(max_sp);
}